

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc local_35;
  int local_34;
  char t;
  char p;
  char c;
  int *piStack_30;
  int maxv;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  piStack_30 = comp;
  comp_local = y;
  y_local = x;
  x_local = (int *)s;
  stbi__rewind(s);
  sVar1 = stbi__get8((stbi__context *)x_local);
  sVar2 = stbi__get8((stbi__context *)x_local);
  if ((sVar1 == 'P') && ((sVar2 == '5' || (sVar2 == '6')))) {
    iVar3 = 1;
    if (sVar2 == '6') {
      iVar3 = 3;
    }
    *piStack_30 = iVar3;
    local_35 = stbi__get8((stbi__context *)x_local);
    stbi__pnm_skip_whitespace((stbi__context *)x_local,(char *)&local_35);
    iVar3 = stbi__pnm_getinteger((stbi__context *)x_local,(char *)&local_35);
    *y_local = iVar3;
    stbi__pnm_skip_whitespace((stbi__context *)x_local,(char *)&local_35);
    iVar3 = stbi__pnm_getinteger((stbi__context *)x_local,(char *)&local_35);
    *comp_local = iVar3;
    stbi__pnm_skip_whitespace((stbi__context *)x_local,(char *)&local_35);
    local_34 = stbi__pnm_getinteger((stbi__context *)x_local,(char *)&local_35);
    if (local_34 < 0x100) {
      s_local._4_4_ = 1;
    }
    else {
      s_local._4_4_ = stbi__err("PPM image not 8-bit");
    }
  }
  else {
    stbi__rewind((stbi__context *)x_local);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv;
   char c, p, t;

   stbi__rewind( s );

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}